

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O3

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  char *__buf;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  long lVar3;
  long *local_40 [2];
  long local_30 [2];
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  __buf = (char *)(lVar3 + 0x44);
  if (*(char *)(lVar3 + 0x44) == '\0') {
    inet_ntop(*(int *)(lVar3 + 0x40),(void *)(lVar3 + 0x72),__buf,0x2e);
  }
  local_40[0] = local_30;
  sVar2 = strlen(__buf);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__buf,__buf + sVar2);
  printf<char_const*>(this,"IPAddressExpr: %s\n",(char *)local_40[0]);
  iVar1 = extraout_EAX;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void ASTPrinter::accept(IPAddressExpr& ipaddr) {
  printf("IPAddressExpr: %s\n", ipaddr.value().str().c_str());
}